

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context,sysbvm_integer_t *integer)

{
  long lVar1;
  long lVar2;
  sysbvm_tuple_t type;
  sysbvm_object_tuple_t *psVar3;
  long lVar4;
  ulong uVar5;
  size_t byteSize;
  ulong uVar6;
  
  if (((ulong)integer & 0xf) == 0 && integer != (sysbvm_integer_t *)0x0) {
    uVar6 = (ulong)((integer->header).objectSize >> 2);
  }
  else {
    uVar6 = 0;
  }
  uVar5 = (ulong)(uint)((int)uVar6 * 4);
  byteSize = uVar5 + 4;
  lVar4 = 0;
  do {
    if (uVar6 + lVar4 == 0) {
      if (uVar6 != 0) {
        return 1;
      }
      return (sysbvm_tuple_t)integer;
    }
    lVar1 = lVar4 + -1;
    byteSize = byteSize - 4;
    lVar2 = lVar4 * 4;
    lVar4 = lVar1;
  } while (*(int *)((long)integer->words + lVar2 + uVar5 + -4) != 0);
  if (lVar1 != -1) {
    uVar6 = uVar6 + lVar1 + 1;
    type = sysbvm_tuple_getType(context,(sysbvm_tuple_t)integer);
    if (uVar6 < 3) {
      uVar5 = *(ulong *)integer->words;
      if (type == (context->roots).largeNegativeIntegerType) {
        if (uVar5 < 0x800000000000001) {
          return uVar5 * -0x10 + 1;
        }
      }
      else if (*(uint *)&integer->field_0x14 < 0x8000000) {
        return uVar5 * 0x10 + 1;
      }
    }
    psVar3 = sysbvm_context_allocateByteTuple(context,type,byteSize);
    memcpy(&psVar3->field_1,integer->words,byteSize);
    return uVar6;
  }
  return (sysbvm_tuple_t)integer;
}

Assistant:

static sysbvm_tuple_t sysbvm_integer_normalize(sysbvm_context_t *context, sysbvm_integer_t *integer)
{
    // Counte the required number of normalized words.
    size_t wordCount = sysbvm_tuple_getSizeInBytes((sysbvm_tuple_t)integer) / 4;
    size_t normalizedWordCount = wordCount;
    while(normalizedWordCount > 0 && integer->words[normalizedWordCount - 1])
        --normalizedWordCount;

    // Trivial cases.
    if(normalizedWordCount == wordCount)
    {
        return (sysbvm_tuple_t)integer;
    }
    else if(normalizedWordCount == 0)
    {
        return sysbvm_tuple_integer_encodeSmall(0);
    }
    
    // Attempt to fit in an immediate, if possible.
    sysbvm_tuple_t largeIntegerType = sysbvm_tuple_getType(context, (sysbvm_tuple_t)integer);
    bool isNegative = largeIntegerType == context->roots.largeNegativeIntegerType;
    if(normalizedWordCount <= 2)
    {
        uint64_t valueUInt64 = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
        if(isNegative)
        {
            if(valueUInt64 <= (uint64_t)-SYSBVM_IMMEDIATE_INT_MIN)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall(-(sysbvm_stuple_t)valueUInt64);
        }
        else
        {
            if(valueUInt64 <= SYSBVM_IMMEDIATE_INT_MAX)
                return (sysbvm_tuple_t)sysbvm_tuple_integer_encodeSmall((sysbvm_stuple_t)valueUInt64);
        }
    }

    // Make a newer smaller large integer.
    sysbvm_integer_t *normalizedResult = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, largeIntegerType, normalizedWordCount*4);
    memcpy(normalizedResult->words, integer->words, 4*normalizedWordCount);
    return (sysbvm_tuple_t)normalizedWordCount;
}